

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

void __thiscall
Imf_2_5::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
TypedAttribute(TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  string *in_RSI;
  Attribute *in_RDI;
  
  Attribute::Attribute(in_RDI);
  in_RDI->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_0340dcb8;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  return;
}

Assistant:

TypedAttribute<T>::TypedAttribute (const T & value):
    Attribute (),
    _value (value)
{
    // empty
}